

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryInit
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,MemoryInit *curr)

{
  Expression **ppEVar1;
  Type local_38;
  Type local_30;
  size_t local_28;
  char *local_20;
  MemoryInit *local_18;
  MemoryInit *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_28 = (curr->memory).super_IString.str._M_len;
  local_20 = (curr->memory).super_IString.str._M_str;
  local_18 = curr;
  curr_local = (MemoryInit *)this;
  notePointer(this,&curr->dest,(Name)(curr->memory).super_IString.str);
  ppEVar1 = &local_18->offset;
  wasm::Type::Type(&local_30,i32);
  note(this,ppEVar1,local_30);
  ppEVar1 = &local_18->size;
  wasm::Type::Type(&local_38,i32);
  note(this,ppEVar1,local_38);
  return;
}

Assistant:

void visitMemoryInit(MemoryInit* curr) {
    notePointer(&curr->dest, curr->memory);
    note(&curr->offset, Type::i32);
    note(&curr->size, Type::i32);
  }